

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_object.c
# Opt level: O0

ssize_t tnt_object_add_int(tnt_stream *s,int64_t value)

{
  long lVar1;
  ssize_t sVar2;
  char *local_38;
  char *end;
  char data [10];
  tnt_sbuf_object *sbo;
  int64_t value_local;
  tnt_stream *s_local;
  
  data._2_8_ = *(long *)((long)s->data + 0x30);
  if ((char)*(long *)(data._2_8_ + 8) != '\0') {
    lVar1 = *(long *)data._2_8_ + (long)(int)(*(byte *)(data._2_8_ + 8) - 1) * 0x10;
    *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
  }
  if (value < 0) {
    local_38 = mp_encode_int((char *)((long)&end + 6),value);
  }
  else {
    local_38 = mp_encode_uint((char *)((long)&end + 6),value);
  }
  sVar2 = (*s->write)(s,(char *)((long)&end + 6),(long)local_38 - ((long)&end + 6));
  return sVar2;
}

Assistant:

ssize_t
tnt_object_add_int (struct tnt_stream *s, int64_t value)
{
	struct tnt_sbuf_object *sbo = TNT_SOBJ_CAST(s);
	if (sbo->stack_size > 0)
		sbo->stack[sbo->stack_size - 1].size += 1;
	char data[10], *end;
	if (value < 0)
		end = mp_encode_int(data, value);
	else
		end = mp_encode_uint(data, value);
	return s->write(s, data, end - data);
}